

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cc
# Opt level: O0

TypeCode * __thiscall
TypeFactory::getTypeCode
          (TypeFactory *this,ProtoModel *model,Datatype *outtype,
          vector<Datatype_*,_std::allocator<Datatype_*>_> *intypes,bool dotdotdot)

{
  byte bVar1;
  Datatype *voidtype;
  TypeCode *pTVar2;
  allocator local_99;
  string local_98 [32];
  undefined1 local_78 [8];
  TypeCode tc;
  bool dotdotdot_local;
  vector<Datatype_*,_std::allocator<Datatype_*>_> *intypes_local;
  Datatype *outtype_local;
  ProtoModel *model_local;
  TypeFactory *this_local;
  
  tc.proto._7_1_ = dotdotdot;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"",&local_99);
  TypeCode::TypeCode((TypeCode *)local_78,(string *)local_98);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  bVar1 = tc.proto._7_1_;
  voidtype = &getTypeVoid(this)->super_Datatype;
  TypeCode::set((TypeCode *)local_78,model,outtype,intypes,(bool)(bVar1 & 1),voidtype);
  pTVar2 = (TypeCode *)findAdd(this,(Datatype *)local_78);
  TypeCode::~TypeCode((TypeCode *)local_78);
  return pTVar2;
}

Assistant:

TypeCode *TypeFactory::getTypeCode(ProtoModel *model,Datatype *outtype,
				   const vector<Datatype *> &intypes,
				   bool dotdotdot)
{
  TypeCode tc("");		// getFuncdata type with no name
  tc.set(model,outtype,intypes,dotdotdot,getTypeVoid());
  return (TypeCode *) findAdd(tc);
}